

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int session_get_incoming_window(SESSION_HANDLE session,uint32_t *incoming_window)

{
  SESSION_INSTANCE *session_instance;
  int result;
  uint32_t *incoming_window_local;
  SESSION_HANDLE session_local;
  
  if ((session == (SESSION_HANDLE)0x0) || (incoming_window == (uint32_t *)0x0)) {
    session_instance._4_4_ = 1000;
  }
  else {
    *incoming_window = session->incoming_window;
    session_instance._4_4_ = 0;
  }
  return session_instance._4_4_;
}

Assistant:

int session_get_incoming_window(SESSION_HANDLE session, uint32_t* incoming_window)
{
    int result;

    if ((session == NULL) ||
        (incoming_window == NULL))
    {
        result = MU_FAILURE;
    }
    else
    {
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)session;

        *incoming_window = session_instance->incoming_window;

        result = 0;
    }

    return result;
}